

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.h
# Opt level: O3

void anurbs::JsonWriter<anurbs::Model>::save_stream<std::__cxx11::stringstream>
               (Model *model,
               basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *stream)

{
  ostream *poVar1;
  value_t vVar2;
  json_value jVar3;
  char cVar4;
  Model *this;
  char cVar5;
  bool bVar6;
  reference pvVar7;
  iterator iVar8;
  key_type *pkVar9;
  ostream *poVar10;
  pointer pbVar11;
  size_t index;
  char *pcVar12;
  iterator result_1;
  Json data;
  string type;
  string key;
  iterator it;
  string_t local_110;
  undefined1 local_f0 [8];
  json_value local_e8;
  undefined1 local_e0 [8];
  json_value local_d8;
  long local_d0;
  Model *local_c8;
  undefined1 local_c0 [8];
  json_value local_b8;
  key_type local_b0;
  string local_90;
  string local_70;
  iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  poVar1 = (ostream *)(stream + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  cVar4 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)(stream + 0x10) + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  if ((model->m_entry_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (model->m_entry_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start) {
    index = 0;
    local_d0 = 0;
    local_c8 = model;
    do {
      this = local_c8;
      Model::get_type_abi_cxx11_(&local_90,local_c8,index);
      Model::get_key_abi_cxx11_(&local_70,this,index);
      local_c0[0] = null;
      local_b8.object = (object_t *)0x0;
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_c0);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_c0);
      if (local_70._M_string_length != 0) {
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_e0,&local_70);
        pvVar7 = nlohmann::
                 basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_c0,"key");
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_e0);
        vVar2 = pvVar7->m_type;
        pvVar7->m_type = local_e0[0];
        jVar3 = pvVar7->m_value;
        pvVar7->m_value = local_d8;
        local_e0[0] = vVar2;
        local_d8 = jVar3;
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pvVar7);
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_e0);
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_e0 + 8),local_e0[0]);
      }
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_f0,&local_90);
      pvVar7 = nlohmann::
               basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_c0,"type");
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_f0);
      vVar2 = pvVar7->m_type;
      pvVar7->m_type = local_f0[0];
      jVar3 = pvVar7->m_value;
      pvVar7->m_value = local_e8;
      local_f0[0] = vVar2;
      local_e8 = jVar3;
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pvVar7);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_f0);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_f0 + 8),local_f0[0]);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
                      *)TypeRegistry<anurbs::Model>::s_registry_abi_cxx11_,&local_b0);
      if (iVar8._M_node == (_Base_ptr)(TypeRegistry<anurbs::Model>::s_registry_abi_cxx11_ + 8)) {
        cVar5 = '\0';
      }
      else {
        cVar5 = (**(code **)(**(long **)(iVar8._M_node + 2) + 0x18))
                          (*(long **)(iVar8._M_node + 2),local_c8,index,
                           (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (cVar5 != '\0') {
        pcVar12 = ",\n  {\n";
        if (local_d0 == 0) {
          pcVar12 = "  {\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,pcVar12,(ulong)(local_d0 != 0) * 2 + 4);
        local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_50.m_it.array_iterator._M_current =
             (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
        local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_50.m_object =
             (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_c0;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin(&local_50);
        local_110._M_string_length = 0;
        local_110.field_2._M_allocated_capacity = 0;
        local_110.field_2._8_8_ = 0x8000000000000000;
        local_110._M_dataplus._M_p = (pointer)local_c0;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&local_110);
        bVar6 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator==(&local_50,
                             (iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_110);
        if (!bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    \"",5);
          pkVar9 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::key(&local_50);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar1,(pkVar9->_M_dataplus)._M_p,pkVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\": ",3);
          pbVar11 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator->(&local_50);
          nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump(&local_110,pbVar11,-1,' ',false,strict);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,local_110._M_dataplus._M_p,local_110._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++(&local_50);
        while( true ) {
          local_110._M_string_length = 0;
          local_110.field_2._M_allocated_capacity = 0;
          local_110.field_2._8_8_ = 0x8000000000000000;
          local_110._M_dataplus._M_p = (pointer)local_c0;
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::set_end((iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)&local_110);
          bVar6 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator==(&local_50,
                               (iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)&local_110);
          if (bVar6) break;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n    \"",7);
          pkVar9 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::key(&local_50);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar1,(pkVar9->_M_dataplus)._M_p,pkVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\": ",3);
          pbVar11 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator->(&local_50);
          nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump(&local_110,pbVar11,-1,' ',false,strict);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,local_110._M_dataplus._M_p,local_110._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++(&local_50);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n  }",4);
        local_d0 = local_d0 + 1;
      }
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_c0);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_c0 + 8),local_c0[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
    } while (index < (ulong)((long)(local_c8->m_entry_map).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_c8->m_entry_map).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n]",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  return;
}

Assistant:

static void save_stream(const TModel& model, TStream& stream)
    {
        stream << "[" << std::endl;

        size_t write_count = 0;

        for (size_t i = 0; i < model.nb_entries(); i++) {
            const auto type = model.get_type(i);
            const auto key = model.get_key(i);

            Json data;

            if (!key.empty()) {
                data["key"] = key;
            }
            data["type"] = type;

            if (!TypeRegistry<TModel>::save(type, model, i, data)) {
                continue;
            }

            if (write_count == 0) {
                stream << "  {\n";
            } else {
                stream << ",\n  {\n";
            }

            auto it = data.begin();
            if (it != data.end()) {
                stream << "    \"" << it.key() << "\": " << it->dump();
            }
            for (++it; it != data.end(); ++it) {
                stream << ",\n    \"" << it.key() << "\": " << it->dump();
            }

            stream << "\n  }";

            write_count += 1;
        }

        stream << "\n]" << std::endl;
    }